

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkFilter vk::mapFilterMode(FilterMode filterMode)

{
  VkFilter local_c;
  FilterMode filterMode_local;
  
  switch(filterMode) {
  case NEAREST:
    local_c = VK_FILTER_NEAREST;
    break;
  case LINEAR:
    local_c = VK_FILTER_LINEAR;
    break;
  case NEAREST_MIPMAP_NEAREST:
    local_c = VK_FILTER_NEAREST;
    break;
  case NEAREST_MIPMAP_LINEAR:
    local_c = VK_FILTER_NEAREST;
    break;
  case LINEAR_MIPMAP_NEAREST:
    local_c = VK_FILTER_LINEAR;
    break;
  case LINEAR_MIPMAP_LINEAR:
    local_c = VK_FILTER_LINEAR;
    break;
  default:
    local_c = VK_FILTER_NEAREST;
  }
  return local_c;
}

Assistant:

VkFilter mapFilterMode (tcu::Sampler::FilterMode filterMode)
{
	DE_STATIC_ASSERT(tcu::Sampler::FILTERMODE_LAST == 6);

	switch (filterMode)
	{
		case tcu::Sampler::NEAREST:					return VK_FILTER_NEAREST;
		case tcu::Sampler::LINEAR:					return VK_FILTER_LINEAR;
		case tcu::Sampler::NEAREST_MIPMAP_NEAREST:	return VK_FILTER_NEAREST;
		case tcu::Sampler::NEAREST_MIPMAP_LINEAR:	return VK_FILTER_NEAREST;
		case tcu::Sampler::LINEAR_MIPMAP_NEAREST:	return VK_FILTER_LINEAR;
		case tcu::Sampler::LINEAR_MIPMAP_LINEAR:	return VK_FILTER_LINEAR;
		default:
			DE_FATAL("Illegal filter mode");
			return (VkFilter)0;
	}
}